

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.cpp
# Opt level: O0

lua_Integer lua_tointegerx(lua_State *L,int idx,int *isnum)

{
  lua_Number num;
  lua_Integer res;
  TValue *o;
  TValue n;
  int *isnum_local;
  int idx_local;
  lua_State *L_local;
  
  n._8_8_ = isnum;
  res = (lua_Integer)index2addr(L,idx);
  if ((((TValue *)res)->tt_ == 3) ||
     (res = (lua_Integer)luaV_tonumber((TValue *)res,(TValue *)&o), (TValue *)res != (TValue *)0x0))
  {
    L_local = (lua_State *)(long)*(double *)res;
    if (n._8_8_ != 0) {
      *(undefined4 *)n._8_8_ = 1;
    }
  }
  else {
    if (n._8_8_ != 0) {
      *(undefined4 *)n._8_8_ = 0;
    }
    L_local = (lua_State *)0x0;
  }
  return (lua_Integer)L_local;
}

Assistant:

LUA_API lua_Integer lua_tointegerx (lua_State *L, int idx, int *isnum) {
  TValue n;
  const TValue *o = index2addr(L, idx);
  if (tonumber(o, &n)) {
    lua_Integer res;
    lua_Number num = nvalue(o);
    lua_number2integer(res, num);
    if (isnum) *isnum = 1;
    return res;
  }
  else {
    if (isnum) *isnum = 0;
    return 0;
  }
}